

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint.cpp
# Opt level: O0

void QMutableEventPoint::update(QEventPoint *other,QEventPoint *target)

{
  long lVar1;
  QPointF arg;
  QPointF arg_00;
  QPointF arg_01;
  QPointF arg_02;
  QPointF arg_03;
  QPointF arg_04;
  QPointF arg_05;
  QSizeF arg_06;
  State SVar2;
  bool bVar3;
  float in_RSI [2];
  long in_FS_OFFSET;
  qreal qVar4;
  QPointF *in_stack_fffffffffffffea8;
  QPointingDeviceUniqueId arg_07;
  QPointF *in_stack_fffffffffffffeb0;
  float this [2];
  QEventPoint *in_stack_fffffffffffffeb8;
  float this_00 [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QEventPoint *)in_stack_fffffffffffffeb0);
  QEventPoint::pressure((QEventPoint *)in_stack_fffffffffffffeb0);
  setPressure((QEventPoint *)in_stack_fffffffffffffeb0,(qreal)in_stack_fffffffffffffea8);
  SVar2 = QEventPoint::state((QEventPoint *)in_stack_fffffffffffffeb0);
  if (SVar2 == Pressed) {
    QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
    arg.yp = (qreal)in_stack_fffffffffffffeb8;
    arg.xp = (qreal)in_stack_fffffffffffffeb0;
    setGlobalPressPosition((QEventPoint *)in_stack_fffffffffffffea8,arg);
    QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
    arg_00.yp = (qreal)in_stack_fffffffffffffeb8;
    arg_00.xp = (qreal)in_stack_fffffffffffffeb0;
    setGlobalLastPosition((QEventPoint *)in_stack_fffffffffffffea8,arg_00);
    qVar4 = QEventPoint::pressure((QEventPoint *)in_stack_fffffffffffffeb0);
    if (qVar4 < 0.0) {
      setPressure((QEventPoint *)in_stack_fffffffffffffeb0,(qreal)in_stack_fffffffffffffea8);
    }
  }
  else if (SVar2 == Released) {
    QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
    QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
    bVar3 = ::operator!=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (bVar3) {
      QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
      arg_01.yp = (qreal)in_stack_fffffffffffffeb8;
      arg_01.xp = (qreal)in_stack_fffffffffffffeb0;
      setGlobalLastPosition((QEventPoint *)in_stack_fffffffffffffea8,arg_01);
    }
    setPressure((QEventPoint *)in_stack_fffffffffffffeb0,(qreal)in_stack_fffffffffffffea8);
  }
  else {
    QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
    QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
    bVar3 = ::operator!=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (bVar3) {
      QEventPoint::globalPosition(in_stack_fffffffffffffeb8);
      arg_02.yp = (qreal)in_stack_fffffffffffffeb8;
      arg_02.xp = (qreal)in_stack_fffffffffffffeb0;
      setGlobalLastPosition((QEventPoint *)in_stack_fffffffffffffea8,arg_02);
    }
    qVar4 = QEventPoint::pressure((QEventPoint *)in_stack_fffffffffffffeb0);
    if (qVar4 < 0.0) {
      setPressure((QEventPoint *)in_stack_fffffffffffffeb0,(qreal)in_stack_fffffffffffffea8);
    }
  }
  arg_07.m_numericId = (qint64)in_RSI;
  QEventPoint::state((QEventPoint *)in_stack_fffffffffffffeb0);
  setState((QEventPoint *)in_stack_fffffffffffffeb0,SUB81(arg_07.m_numericId,7));
  this = in_RSI;
  QEventPoint::position(in_stack_fffffffffffffeb8);
  arg_03.yp = (qreal)in_stack_fffffffffffffeb8;
  arg_03.xp = (qreal)this;
  setPosition((QEventPoint *)arg_07.m_numericId,arg_03);
  this_00 = in_RSI;
  QEventPoint::scenePosition((QEventPoint *)in_RSI);
  arg_04.yp = (qreal)this_00;
  arg_04.xp = (qreal)this;
  setScenePosition((QEventPoint *)arg_07.m_numericId,arg_04);
  QEventPoint::globalPosition((QEventPoint *)this_00);
  arg_05.yp = (qreal)this_00;
  arg_05.xp = (qreal)this;
  setGlobalPosition((QEventPoint *)arg_07.m_numericId,arg_05);
  QEventPoint::ellipseDiameters((QEventPoint *)this_00);
  arg_06.ht = (qreal)this_00;
  arg_06.wd = (qreal)this;
  setEllipseDiameters((QEventPoint *)arg_07.m_numericId,arg_06);
  QEventPoint::rotation((QEventPoint *)this);
  setRotation((QEventPoint *)this,(qreal)arg_07.m_numericId);
  QEventPoint::velocity((QEventPoint *)in_RSI);
  setVelocity((QEventPoint *)0x344b8c,(QVector2D)arg_07.m_numericId);
  QEventPoint::uniqueId((QEventPoint *)this_00);
  setUniqueId((QEventPoint *)0x344bba,arg_07);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMutableEventPoint::update(const QEventPoint &other, QEventPoint &target)
{
    detach(target);
    setPressure(target, other.pressure());

    switch (other.state()) {
    case QEventPoint::State::Pressed:
        setGlobalPressPosition(target, other.globalPosition());
        setGlobalLastPosition(target, other.globalPosition());
        if (target.pressure() < 0)
            setPressure(target, 1);
        break;

    case QEventPoint::State::Released:
        if (target.globalPosition() != other.globalPosition())
            setGlobalLastPosition(target, target.globalPosition());
        setPressure(target, 0);
        break;

    default: // update or stationary
        if (target.globalPosition() != other.globalPosition())
            setGlobalLastPosition(target, target.globalPosition());
        if (target.pressure() < 0)
            setPressure(target, 1);
        break;
    }

    setState(target, other.state());
    setPosition(target, other.position());
    setScenePosition(target, other.scenePosition());
    setGlobalPosition(target, other.globalPosition());
    setEllipseDiameters(target, other.ellipseDiameters());
    setRotation(target, other.rotation());
    setVelocity(target, other.velocity());
    setUniqueId(target, other.uniqueId()); // for TUIO
}